

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QPostEvent>::emplace<QPostEvent_const&>
          (QMovableArrayOps<QPostEvent> *this,qsizetype i,QPostEvent *args)

{
  QPostEvent **ppQVar1;
  QPostEvent *pQVar2;
  int iVar3;
  Data *pDVar4;
  QPostEvent *pQVar5;
  QObject *pQVar6;
  QEvent *pQVar7;
  undefined4 uVar8;
  qsizetype *pqVar9;
  bool bVar10;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  
  pDVar4 = (this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00340ca0:
    pQVar6 = args->receiver;
    pQVar7 = args->event;
    iVar3 = args->priority;
    uVar8 = *(undefined4 *)&args->field_0x14;
    bVar10 = (this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.size !=
             0;
    QArrayDataPointer<QPostEvent>::detachAndGrow
              ((QArrayDataPointer<QPostEvent> *)this,(uint)(i == 0 && bVar10),1,(QPostEvent **)0x0,
               (QArrayDataPointer<QPostEvent> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.ptr;
    local_38 = (undefined1)uVar8;
    local_37 = (undefined1)((uint)uVar8 >> 8);
    local_36 = (undefined1)((uint)uVar8 >> 0x10);
    local_35 = (undefined1)((uint)uVar8 >> 0x18);
    if (i != 0 || !bVar10) {
      pQVar2 = pQVar5 + i;
      memmove(pQVar2 + 1,pQVar5 + i,
              ((this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.size -
              i) * 0x18);
      pQVar2->receiver = pQVar6;
      pQVar2->event = pQVar7;
      pQVar2->priority = iVar3;
      pQVar2->field_0x14 = local_38;
      pQVar2->field_0x15 = local_37;
      pQVar2->field_0x16 = local_36;
      pQVar2->field_0x17 = local_35;
      goto LAB_00340d80;
    }
    pQVar5[-1].receiver = pQVar6;
    pQVar5[-1].event = pQVar7;
    pQVar5[-1].priority = iVar3;
    pQVar5[-1].field_0x14 = local_38;
    pQVar5[-1].field_0x15 = local_37;
    pQVar5[-1].field_0x16 = local_36;
    pQVar5[-1].field_0x17 = local_35;
  }
  else {
    if (((this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.size == i)
       && (pQVar5 = (this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.
                    ptr,
          (pDVar4->super_QArrayData).alloc - i !=
          ((long)((long)pQVar5 -
                 ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3)
          * -0x5555555555555555)) {
      uVar8 = *(undefined4 *)&args->field_0x14;
      pQVar5[i].priority = args->priority;
      *(undefined4 *)&pQVar5[i].field_0x14 = uVar8;
      pQVar7 = args->event;
      pQVar5[i].receiver = args->receiver;
      pQVar5[i].event = pQVar7;
      goto LAB_00340d80;
    }
    if ((i != 0) ||
       (pQVar5 = (this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.ptr,
       (QPostEvent *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pQVar5)) goto LAB_00340ca0;
    uVar8 = *(undefined4 *)&args->field_0x14;
    pQVar5[-1].priority = args->priority;
    *(undefined4 *)&pQVar5[-1].field_0x14 = uVar8;
    pQVar7 = args->event;
    pQVar5[-1].receiver = args->receiver;
    pQVar5[-1].event = pQVar7;
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_00340d80:
  pqVar9 = &(this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.size;
  *pqVar9 = *pqVar9 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }